

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::anon_unknown_5::CurrencySpacingSink::resolveMissing(CurrencySpacingSink *this)

{
  DecimalFormatSymbols *this_00;
  UCurrencySpacing type;
  char beforeCurrency_00;
  UnicodeString local_58;
  UCurrencySpacing local_18;
  char local_11;
  int32_t pattern;
  UBool beforeCurrency;
  CurrencySpacingSink *this_local;
  
  if ((this->hasBeforeCurrency == '\0') || (this->hasAfterCurrency == '\0')) {
    _pattern = this;
    for (local_11 = '\0'; local_11 < '\x02'; local_11 = local_11 + '\x01') {
      for (local_18 = UNUM_CURRENCY_MATCH; beforeCurrency_00 = local_11, type = local_18,
          (int)local_18 < 3; local_18 = local_18 + UNUM_CURRENCY_SURROUNDING_MATCH) {
        this_00 = this->dfs;
        UnicodeString::UnicodeString
                  (&local_58,resolveMissing::defaults[(int)local_18],-1,kInvariant);
        DecimalFormatSymbols::setPatternForCurrencySpacing(this_00,type,beforeCurrency_00,&local_58)
        ;
        UnicodeString::~UnicodeString(&local_58);
      }
    }
  }
  return;
}

Assistant:

void resolveMissing() {
        // For consistency with Java, this method overwrites everything with the defaults unless
        // both beforeCurrency and afterCurrency were found in CLDR.
        static const char* defaults[] = { "[:letter:]", "[:digit:]", " " };
        if (!hasBeforeCurrency || !hasAfterCurrency) {
            for (UBool beforeCurrency = 0; beforeCurrency <= TRUE; beforeCurrency++) {
                for (int32_t pattern = 0; pattern < UNUM_CURRENCY_SPACING_COUNT; pattern++) {
                    dfs.setPatternForCurrencySpacing((UCurrencySpacing)pattern,
                        beforeCurrency, UnicodeString(defaults[pattern], -1, US_INV));
                }
            }
        }
    }